

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::BoundaryNear(S2Polygon *this,S2Polygon *b,S1Angle max_error)

{
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> b_00;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  bool bVar1;
  bool bVar2;
  pointer puVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  if ((int)((ulong)((long)(this->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) ==
      (int)((ulong)((long)(b->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(b->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    puVar3 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3);
    bVar1 = iVar4 < 1;
    if ((0 < iVar4) &&
       (0 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->loops_).
                               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
      lVar6 = 0;
      while( true ) {
        b_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
             (puVar3->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
        lVar7 = 0;
        bVar5 = false;
        do {
          this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
               (b->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
          if ((*(int *)((long)this_00._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8) ==
               *(int *)((long)b_00._M_t.
                              super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                              super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8)) &&
             (bVar2 = S2Loop::BoundaryNear
                                ((S2Loop *)
                                 this_00._M_t.
                                 super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                                 super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,
                                 (S2Loop *)
                                 b_00._M_t.
                                 super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                                 super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl,max_error),
             bVar2)) {
            bVar5 = true;
            bVar2 = false;
          }
          else {
            bVar2 = true;
          }
        } while ((bVar2) &&
                (lVar7 = lVar7 + 1,
                lVar7 < (int)((ulong)((long)(this->loops_).
                                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->loops_).
                                           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3)));
        if (!bVar5) break;
        lVar6 = lVar6 + 1;
        puVar3 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)(int)((ulong)((long)(this->loops_).
                                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                           >> 3);
        bVar1 = lVar7 <= lVar6;
        if (lVar7 <= lVar6) {
          return bVar1;
        }
        puVar3 = puVar3 + lVar6;
        if ((int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->loops_).
                               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
          return bVar1;
        }
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2Polygon::BoundaryNear(const S2Polygon& b, S1Angle max_error) const {
  if (num_loops() != b.num_loops()) return false;

  // For now, we assume that there is at most one candidate match for each
  // loop.  (So far this method is just used for testing.)

  for (int i = 0; i < num_loops(); ++i) {
    const S2Loop& a_loop = *loop(i);
    bool success = false;
    for (int j = 0; j < num_loops(); ++j) {
      const S2Loop& b_loop = *b.loop(j);
      if (b_loop.depth() == a_loop.depth() &&
          b_loop.BoundaryNear(a_loop, max_error)) {
        success = true;
        break;
      }
    }
    if (!success) return false;
  }
  return true;
}